

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O3

void __thiscall
capnp::compiler::NodeTranslator::StructTranslator::traverseParams
          (StructTranslator *this,Reader params,MemberInfo *parent,StructOrGroup *layout)

{
  RemoveConst<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> **pppMVar1;
  RemoveConst<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *ppMVar2;
  MemberInfo *pMVar3;
  RemoveConst<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *ppMVar4;
  size_t newSize;
  ulong uVar5;
  Reader param;
  ElementCount local_9c;
  Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> *local_98;
  _Rb_tree<unsigned_int,std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>,std::_Select1st<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>>
  *local_90;
  Arena *local_88;
  ulong local_80;
  StructOrGroup *local_78;
  pair<unsigned_int,_capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*> local_70;
  StructReader local_60;
  
  local_80 = (ulong)params.reader.elementCount;
  if (local_80 != 0) {
    local_88 = &this->arena;
    local_98 = &this->allMembers;
    local_90 = (_Rb_tree<unsigned_int,std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>,std::_Select1st<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>>
                *)&this->membersByOrdinal;
    uVar5 = 0;
    local_78 = layout;
    do {
      local_9c = (ElementCount)uVar5;
      capnp::_::ListReader::getStructElement(&local_60,&params.reader,local_9c);
      parent->childCount = parent->childCount + 1;
      local_70.first = local_70.first & 0xffffff00;
      pMVar3 = kj::Arena::
               allocate<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo&,unsigned_int&,capnp::compiler::Declaration::Param::Reader&,capnp::compiler::NodeTranslator::StructLayout::StructOrGroup&,bool>
                         (local_88,parent,&local_9c,(Reader *)&local_60,local_78,(bool *)&local_70);
      ppMVar4 = (this->allMembers).builder.pos;
      if (ppMVar4 == (this->allMembers).builder.endPtr) {
        ppMVar2 = (this->allMembers).builder.ptr;
        newSize = (long)ppMVar4 - (long)ppMVar2 >> 2;
        if (ppMVar4 == ppMVar2) {
          newSize = 4;
        }
        kj::Vector<capnp::compiler::NodeTranslator::StructTranslator::MemberInfo_*>::setCapacity
                  (local_98,newSize);
        ppMVar4 = (this->allMembers).builder.pos;
      }
      *ppMVar4 = pMVar3;
      pppMVar1 = &(this->allMembers).builder.pos;
      *pppMVar1 = *pppMVar1 + 1;
      local_70.first = local_9c;
      local_70.second = pMVar3;
      std::
      _Rb_tree<unsigned_int,std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>,std::_Select1st<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>>
      ::
      _M_emplace_equal<std::pair<unsigned_int,capnp::compiler::NodeTranslator::StructTranslator::MemberInfo*>>
                (local_90,&local_70);
      uVar5 = uVar5 + 1;
    } while (local_80 != uVar5);
  }
  return;
}

Assistant:

void traverseParams(List<Declaration::Param>::Reader params, MemberInfo& parent,
                      StructLayout::StructOrGroup& layout) {
    for (uint i: kj::indices(params)) {
      auto param = params[i];
      parent.childCount++;
      MemberInfo* memberInfo = &arena.allocate<MemberInfo>(parent, i, param, layout, false);
      allMembers.add(memberInfo);
      membersByOrdinal.insert(std::make_pair(i, memberInfo));
    }
  }